

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  int iVar3;
  service *psVar4;
  io_context io_context;
  string path;
  string host;
  Client client;
  io_context local_328;
  error_code local_318;
  string local_308;
  string local_2e8;
  system_error local_2c8;
  undefined1 local_288 [568];
  locale local_50 [16];
  pointer local_40;
  pointer local_28;
  
  if (argc == 3) {
    std::__cxx11::string::string((string *)&local_2e8,argv[1],(allocator *)local_288);
    std::__cxx11::string::string((string *)&local_308,argv[2],(allocator *)local_288);
    boost::asio::io_context::io_context(&local_328);
    Client::Client((Client *)local_288,&local_328,&local_2e8,&local_308);
    boost::system::error_code::error_code(&local_318);
    boost::asio::detail::scheduler::run(local_328.impl_,&local_318);
    if (local_318.failed_ == true) {
      std::runtime_error::runtime_error(&local_2c8.super_runtime_error,"");
      local_2c8.m_what._M_dataplus._M_p = (pointer)((long)&local_2c8 + 0x30);
      local_2c8._0_8_ = &PTR__system_error_0015e7e8;
      local_2c8.m_error_code.cat_ = local_318.cat_;
      local_2c8.m_what._M_string_length = 0;
      local_2c8.m_what.field_2._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>(&local_2c8);
    }
    if (local_28 != (pointer)0x0) {
      operator_delete(local_28);
    }
    local_288._512_8_ = &PTR__basic_streambuf_0015eb38;
    if (local_40 != (pointer)0x0) {
      operator_delete(local_40);
    }
    local_288._512_8_ = __assert_fail;
    std::locale::~locale(local_50);
    boost::asio::ssl::detail::stream_core::~stream_core((stream_core *)(local_288 + 0xb0));
    boost::asio::detail::
    io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)(local_288 + 0x60));
    boost::asio::ssl::context::~context((context *)(local_288 + 0x48));
    if ((undefined1 *)local_288._40_8_ != local_288 + 0x38) {
      operator_delete((void *)local_288._40_8_);
    }
    if ((undefined1 *)local_288._8_8_ != local_288 + 0x18) {
      operator_delete((void *)local_288._8_8_);
    }
    for (psVar4 = (local_328.super_execution_context.service_registry_)->first_service_;
        eVar2.service_registry_ = local_328.super_execution_context.service_registry_,
        psVar4 != (service *)0x0; psVar4 = psVar4->next_) {
      (*psVar4->_vptr_service[2])(psVar4);
    }
    psVar4 = (local_328.super_execution_context.service_registry_)->first_service_;
    while (psVar4 != (service *)0x0) {
      ppp_Var1 = &psVar4->_vptr_service;
      psVar4 = psVar4->next_;
      (*(*ppp_Var1)[1])();
      (eVar2.service_registry_)->first_service_ = psVar4;
    }
    if (local_328.super_execution_context.service_registry_ != (service_registry *)0x0) {
      pthread_mutex_destroy
                ((pthread_mutex_t *)&(local_328.super_execution_context.service_registry_)->mutex_);
      operator_delete(local_328.super_execution_context.service_registry_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    iVar3 = 0;
  }
  else {
    Help(*argv);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc != 3) {
    Help(argv[0]);
    return 1;
  }

  std::string host = argv[1];
  std::string path = argv[2];

  try {
    boost::asio::io_context io_context;

    Client client(io_context, host, path);

    io_context.run();

  } catch (const std::exception& e) {
    std::cout << "Exception: " << e.what() << std::endl;
  }

  return 0;
}